

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::anon_unknown_0::ReportReflectionUsageEnumTypeError
               (Descriptor *descriptor,FieldDescriptor *field,char *method,
               EnumValueDescriptor *value)

{
  EnumDescriptor *this;
  LogMessage *this_00;
  LogMessage *other;
  EnumValueDescriptor *in_RCX;
  FieldDescriptor *in_RSI;
  Descriptor *in_RDI;
  string *in_stack_ffffffffffffff28;
  LogMessage *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  LogMessage *in_stack_ffffffffffffff40;
  
  internal::LogMessage::LogMessage
            (in_stack_ffffffffffffff40,(LogLevel_conflict)((ulong)in_stack_ffffffffffffff38 >> 0x20)
             ,(char *)in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  internal::LogMessage::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
  internal::LogMessage::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
  internal::LogMessage::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
  Descriptor::full_name_abi_cxx11_(in_RDI);
  internal::LogMessage::operator<<(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  internal::LogMessage::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
  FieldDescriptor::full_name_abi_cxx11_(in_RSI);
  internal::LogMessage::operator<<(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  internal::LogMessage::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
  this = FieldDescriptor::enum_type((FieldDescriptor *)in_stack_ffffffffffffff30);
  EnumDescriptor::full_name_abi_cxx11_(this);
  internal::LogMessage::operator<<(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  internal::LogMessage::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
  this_00 = (LogMessage *)EnumValueDescriptor::full_name_abi_cxx11_(in_RCX);
  other = internal::LogMessage::operator<<(this_00,in_stack_ffffffffffffff28);
  internal::LogFinisher::operator=((LogFinisher *)this_00,other);
  internal::LogMessage::~LogMessage((LogMessage *)0x4255ee);
  return;
}

Assistant:

static void ReportReflectionUsageEnumTypeError(
    const Descriptor* descriptor, const FieldDescriptor* field,
    const char* method, const EnumValueDescriptor* value) {
  GOOGLE_LOG(FATAL) << "Protocol Buffer reflection usage error:\n"
                "  Method      : google::protobuf::Reflection::"
             << method
             << "\n"
                "  Message type: "
             << descriptor->full_name()
             << "\n"
                "  Field       : "
             << field->full_name()
             << "\n"
                "  Problem     : Enum value did not match field type:\n"
                "    Expected  : "
             << field->enum_type()->full_name()
             << "\n"
                "    Actual    : "
             << value->full_name();
}